

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v4.cpp
# Opt level: O2

ssize_t __thiscall
LASreadItemCompressed_WAVEPACKET14_v4::read
          (LASreadItemCompressed_WAVEPACKET14_v4 *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  I32 pred;
  I32 pred_00;
  I32 pred_01;
  I32 pred_02;
  U64 UVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  U32 UVar6;
  I32 IVar7;
  ulong uVar8;
  ulong extraout_RAX;
  undefined4 in_register_00000034;
  undefined8 *puVar9;
  U8 *item;
  LASwavepacket13 this_item_m;
  
  puVar9 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  uVar8 = (ulong)this->current_context;
  item = this->contexts[uVar8].last_item;
  uVar1 = *__buf;
  if (this->current_context != uVar1) {
    this->current_context = uVar1;
    uVar8 = (ulong)uVar1;
    if (this->contexts[uVar1].unused == true) {
      createAndInitModelsAndDecompressors(this,uVar1,item);
      uVar8 = (ulong)this->current_context;
    }
    item = this->contexts[uVar8].last_item;
  }
  if (this->changed_wavepacket == true) {
    UVar6 = ArithmeticDecoder::decodeSymbol
                      (this->dec_wavepacket,this->contexts[uVar8].m_packet_index);
    *(char *)puVar9 = (char)UVar6;
    UVar2 = *(U64 *)(item + 1);
    uVar1 = *(uint *)(item + 9);
    pred = *(I32 *)(item + 0xd);
    pred_00 = *(I32 *)(item + 0x11);
    pred_01 = *(I32 *)(item + 0x15);
    pred_02 = *(I32 *)(item + 0x19);
    UVar6 = ArithmeticDecoder::decodeSymbol
                      (this->dec_wavepacket,
                       this->contexts[this->current_context].m_offset_diff
                       [this->contexts[this->current_context].sym_last_offset_diff]);
    uVar8 = (ulong)this->current_context;
    this->contexts[uVar8].sym_last_offset_diff = UVar6;
    if (UVar6 == 2) {
      IVar7 = IntegerCompressor::decompress
                        (this->contexts[uVar8].ic_offset_diff,this->contexts[uVar8].last_diff_32,0);
      uVar8 = (ulong)this->current_context;
      this->contexts[uVar8].last_diff_32 = IVar7;
      this_item_m.offset = UVar2 + (long)IVar7;
    }
    else if (UVar6 == 1) {
      this_item_m.offset = UVar2 + uVar1;
    }
    else {
      this_item_m.offset = UVar2;
      if (UVar6 != 0) {
        this_item_m.offset = ArithmeticDecoder::readInt64(this->dec_wavepacket);
        uVar8 = (ulong)this->current_context;
      }
    }
    this_item_m.packet_size =
         IntegerCompressor::decompress(this->contexts[uVar8].ic_packet_size,uVar1,0);
    this_item_m.return_point.i32 =
         IntegerCompressor::decompress(this->contexts[this->current_context].ic_return_point,pred,0)
    ;
    this_item_m.x.i32 =
         IntegerCompressor::decompress(this->contexts[this->current_context].ic_xyz,pred_00,0);
    this_item_m.y.i32 =
         IntegerCompressor::decompress(this->contexts[this->current_context].ic_xyz,pred_01,1);
    this_item_m.z.i32 =
         IntegerCompressor::decompress(this->contexts[this->current_context].ic_xyz,pred_02,2);
    LASwavepacket13::pack(&this_item_m,(U8 *)((long)puVar9 + 1));
    uVar3 = *puVar9;
    uVar4 = puVar9[1];
    uVar5 = *(undefined8 *)((long)puVar9 + 0x15);
    *(undefined8 *)(item + 0xd) = *(undefined8 *)((long)puVar9 + 0xd);
    *(undefined8 *)(item + 0x15) = uVar5;
    *(undefined8 *)item = uVar3;
    *(undefined8 *)(item + 8) = uVar4;
    uVar8 = extraout_RAX;
  }
  return uVar8;
}

Assistant:

inline void LASreadItemCompressed_WAVEPACKET14_v4::read(U8* item, U32& context)
{
  // get last

  U8* last_item = contexts[current_context].last_item;

  // check for context switch

  if (current_context != context)
  {
    current_context = context; // all other items use context set by POINT14 reader
    if (contexts[current_context].unused)
    {
      createAndInitModelsAndDecompressors(current_context, last_item);
    }
    last_item = contexts[current_context].last_item;
  }

  // decompress

  if (changed_wavepacket)
  {
    item[0] = (U8)(dec_wavepacket->decodeSymbol(contexts[current_context].m_packet_index));

    LASwavepacket13 this_item_m;
    LASwavepacket13 last_item_m = LASwavepacket13::unpack(last_item+1);

    contexts[current_context].sym_last_offset_diff = dec_wavepacket->decodeSymbol(contexts[current_context].m_offset_diff[contexts[current_context].sym_last_offset_diff]);

    if (contexts[current_context].sym_last_offset_diff == 0)
    {
      this_item_m.offset = last_item_m.offset;
    }
    else if (contexts[current_context].sym_last_offset_diff == 1)
    {
      this_item_m.offset = last_item_m.offset + last_item_m.packet_size;
    }
    else if (contexts[current_context].sym_last_offset_diff == 2)
    {
      contexts[current_context].last_diff_32 = contexts[current_context].ic_offset_diff->decompress(contexts[current_context].last_diff_32);
      this_item_m.offset = last_item_m.offset + contexts[current_context].last_diff_32;
    }
    else
    {
      this_item_m.offset = dec_wavepacket->readInt64();
    }

    this_item_m.packet_size = contexts[current_context].ic_packet_size->decompress(last_item_m.packet_size);
    this_item_m.return_point.i32 = contexts[current_context].ic_return_point->decompress(last_item_m.return_point.i32);
    this_item_m.x.i32 = contexts[current_context].ic_xyz->decompress(last_item_m.x.i32, 0);
    this_item_m.y.i32 = contexts[current_context].ic_xyz->decompress(last_item_m.y.i32, 1);
    this_item_m.z.i32 = contexts[current_context].ic_xyz->decompress(last_item_m.z.i32, 2);

    this_item_m.pack(item+1);

    memcpy(last_item, item, 29);
  }
}